

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_ssm_conv(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined8 uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  void *pvVar25;
  ulong uVar26;
  undefined1 auVar27 [64];
  ulong local_78;
  int local_48;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
               ,0x1d4b,"fatal error");
  }
  iVar16 = (int)pgVar1->ne[1];
  if (dst->ne[0] == (long)iVar16) {
    if (pgVar1->nb[0] == 4) {
      pgVar2 = dst->src[1];
      if (pgVar2->nb[0] == 4) {
        lVar3 = pgVar1->ne[0];
        sVar4 = pgVar1->nb[1];
        if (sVar4 == lVar3 * 4) {
          uVar5 = dst->ne[2];
          if (0 < (int)uVar5) {
            uVar6 = pgVar2->ne[0];
            uVar7 = dst->ne[1];
            iVar15 = (params->nth + -1 + iVar16) / params->nth;
            iVar22 = params->ith * iVar15;
            iVar15 = iVar15 + iVar22;
            if (iVar16 <= iVar15) {
              iVar15 = iVar16;
            }
            lVar18 = (long)iVar22;
            iVar16 = (int)uVar6;
            local_78 = 0;
            do {
              local_48 = (int)uVar7;
              if (0 < local_48) {
                sVar8 = pgVar2->nb[1];
                pvVar9 = pgVar2->data;
                sVar10 = dst->nb[0];
                pvVar11 = dst->data;
                sVar12 = dst->nb[1];
                sVar13 = dst->nb[2];
                lVar20 = (long)pgVar1->data + pgVar1->nb[2] * local_78 + sVar4 * lVar18;
                uVar19 = 0;
                do {
                  if (0 < iVar15 - iVar22) {
                    uVar23 = 0;
                    lVar24 = lVar20;
                    pvVar25 = (void *)(sVar8 * lVar18 + (long)pvVar9);
                    do {
                      auVar27 = ZEXT1664(ZEXT816(0) << 0x40);
                      if (0 < iVar16) {
                        uVar26 = 0;
                        do {
                          auVar14 = vfmadd231ss_fma(auVar27._0_16_,
                                                    ZEXT416(*(uint *)(lVar24 + uVar26 * 4)),
                                                    ZEXT416(*(uint *)((long)pvVar25 + uVar26 * 4)));
                          auVar27 = ZEXT1664(auVar14);
                          uVar26 = uVar26 + 1;
                        } while ((uVar6 & 0x7fffffff) != uVar26);
                      }
                      *(int *)((long)pvVar11 +
                              uVar23 * 4 + uVar19 * sVar12 + sVar13 * local_78 + sVar10 * lVar18) =
                           auVar27._0_4_;
                      uVar23 = uVar23 + 1;
                      pvVar25 = (void *)((long)pvVar25 + (long)iVar16 * 4);
                      lVar24 = lVar24 + (long)(int)lVar3 * 4;
                    } while (uVar23 != (uint)(iVar15 - iVar22));
                  }
                  uVar19 = uVar19 + 1;
                  lVar20 = lVar20 + 4;
                } while (uVar19 != (uVar7 & 0x7fffffff));
              }
              local_78 = local_78 + 1;
            } while (local_78 != (uVar5 & 0x7fffffff));
          }
          return;
        }
        pcVar17 = "src0->nb[1] == src0->ne[0]*sizeof(float)";
        uVar21 = 0x1d1e;
      }
      else {
        pcVar17 = "src1->nb[0] == sizeof(float)";
        uVar21 = 0x1d1d;
      }
    }
    else {
      pcVar17 = "src0->nb[0] == sizeof(float)";
      uVar21 = 0x1d1c;
    }
  }
  else {
    pcVar17 = "dst->ne[0] == nr";
    uVar21 = 0x1d1b;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
             ,uVar21,"GGML_ASSERT(%s) failed",pcVar17);
}

Assistant:

void ggml_compute_forward_ssm_conv(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    switch (dst->src[0]->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_ssm_conv_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}